

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O1

shared_ptr<QSslContext> __thiscall
QSslContext::sharedFromPrivateConfiguration
          (QSslContext *this,SslMode mode,QSslConfigurationPrivate *privConfiguration,
          bool allowRootCertOnDemandLoading)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<QSslContext> sVar1;
  QSslConfiguration local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (privConfiguration != (QSslConfigurationPrivate *)0x0) {
    LOCK();
    *(int *)privConfiguration = *(int *)privConfiguration + 1;
    UNLOCK();
  }
  local_20.d.d.ptr =
       (QSharedDataPointer<QSslConfigurationPrivate>)
       (QSharedDataPointer<QSslConfigurationPrivate>)privConfiguration;
  sharedFromConfiguration(this,mode,&local_20,allowRootCertOnDemandLoading);
  QSslConfiguration::~QSslConfiguration(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<QSslContext>)
           sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<QSslContext> QSslContext::sharedFromPrivateConfiguration(QSslSocket::SslMode mode, QSslConfigurationPrivate *privConfiguration,
                                                                        bool allowRootCertOnDemandLoading)
{
    return sharedFromConfiguration(mode, privConfiguration, allowRootCertOnDemandLoading);
}